

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speculative.cpp
# Opt level: O3

llama_tokens *
common_speculative_gen_draft
          (llama_tokens *__return_storage_ptr__,common_speculative *spec,
          common_speculative_params params,llama_tokens *prompt_tgt,llama_token id_last)

{
  float *pfVar1;
  llama_token lVar2;
  iterator iVar3;
  common_speculative *pcVar4;
  undefined8 uVar5;
  int iVar6;
  common_log *pcVar7;
  pointer piVar8;
  pointer piVar9;
  llama_token_data_array *plVar10;
  size_t sVar11;
  int iVar12;
  int *piVar13;
  size_t __n;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  pointer piVar18;
  llama_tokens *plVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  uint uVar24;
  uint uVar25;
  long lVar26;
  vector<int,std::allocator<int>> *pvVar27;
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  llama_token id;
  llama_tokens *result;
  undefined8 in_stack_ffffffffffffff18;
  undefined4 uVar28;
  int local_ac;
  vector<int,std::allocator<int>> *local_a8;
  common_speculative *local_a0;
  llama_batch *local_98;
  llama_token local_8c;
  llama_tokens *local_88;
  int local_80;
  allocator_type local_79;
  ulong local_78;
  undefined8 local_70;
  string local_68;
  vector<int,std::allocator<int>> *local_48;
  ulong local_40;
  float local_34;
  
  uVar28 = (undefined4)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  local_34 = params.p_min;
  local_a8 = (vector<int,std::allocator<int>> *)__return_storage_ptr__;
  local_8c = id_last;
  iVar6 = llama_n_ctx(spec->ctx);
  iVar6 = iVar6 - params.n_draft;
  piVar9 = (prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar12 = (int)((ulong)((long)(prompt_tgt->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish - (long)piVar9) >> 2);
  uVar25 = iVar12 - iVar6;
  uVar24 = 0;
  if ((int)uVar25 < 1) {
    uVar25 = 0;
  }
  piVar8 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar21 = (ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish - (long)piVar8) >> 2;
  uVar22 = 0;
  uVar20 = (uint)uVar21;
  if (0 < (int)uVar20) {
    uVar23 = 0;
    do {
      uVar14 = 0;
      if ((int)uVar25 < iVar12) {
        uVar15 = 0;
        while ((uVar21 & 0xffffffff) != uVar15) {
          uVar16 = uVar15;
          if ((piVar9[uVar25 + uVar15] != piVar8[uVar15]) ||
             (uVar15 = uVar15 + 1, uVar16 = (ulong)(iVar12 - uVar25), iVar12 - uVar25 == uVar15))
          goto LAB_0020fbed;
        }
        uVar16 = uVar21 & 0xffffffff;
LAB_0020fbed:
        uVar14 = (uint)uVar16;
      }
      if (((params.n_reuse <= (int)uVar14) || (iVar12 <= iVar6)) && ((int)uVar24 < (int)uVar14)) {
        uVar22 = (uint)uVar23;
        uVar24 = uVar14;
      }
      uVar23 = uVar23 + 1;
      uVar21 = (ulong)((int)uVar21 - 1);
      piVar8 = piVar8 + 1;
    } while (uVar23 != (uVar20 & 0x7fffffff));
  }
  local_a0 = spec;
  local_88 = prompt_tgt;
  local_70 = params._0_8_;
  if (0 < common_log_verbosity_thold) {
    pcVar7 = common_log_main();
    common_log_add(pcVar7,GGML_LOG_LEVEL_DEBUG,"%s: reuse_i = %d, reuse_n = %d, prompt = %d\n",
                   "common_speculative_gen_draft",(ulong)uVar22,(ulong)uVar24,
                   CONCAT44(uVar28,(int)((ulong)((long)(spec->prompt).
                                                       super__Vector_base<int,_std::allocator<int>_>
                                                       ._M_impl.super__Vector_impl_data._M_finish -
                                                (long)(spec->prompt).
                                                      super__Vector_base<int,_std::allocator<int>_>.
                                                      _M_impl.super__Vector_impl_data._M_start) >> 2
                                        )));
  }
  *(undefined8 *)local_a8 = 0;
  *(pointer *)(local_a8 + 8) = (pointer)0x0;
  *(pointer *)(local_a8 + 0x10) = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)local_a8,(long)(int)local_70);
  uVar5 = local_70;
  plVar19 = local_88;
  pvVar27 = local_a8;
  local_48 = (vector<int,std::allocator<int>> *)&spec->prompt;
  if (uVar24 == 0) {
    llama_kv_self_clear(spec->ctx);
    piVar9 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish == piVar9) goto LAB_0020fde6;
  }
  else {
    piVar9 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar8 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (((int)(uVar22 + uVar24) < (int)((ulong)((long)piVar8 - (long)piVar9) >> 2)) &&
       (lVar17 = (long)(int)(uVar22 + uVar24), piVar9[lVar17] == local_8c)) {
      lVar26 = lVar17 * 4;
      do {
        lVar26 = lVar26 + 4;
        lVar17 = lVar17 + 1;
        piVar9 = (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if ((int)((ulong)((long)(local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_finish - (long)piVar9) >> 2) <=
            lVar17) {
          return (llama_tokens *)pvVar27;
        }
        piVar13 = (int *)((long)piVar9 + lVar26);
        iVar3._M_current = *(int **)(pvVar27 + 8);
        if (iVar3._M_current == *(int **)(pvVar27 + 0x10)) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar27,iVar3,piVar13)
          ;
          piVar13 = *(int **)(pvVar27 + 8);
        }
        else {
          *iVar3._M_current = *piVar13;
          piVar13 = iVar3._M_current + 1;
          *(int **)(pvVar27 + 8) = piVar13;
        }
      } while ((int)((ulong)((long)piVar13 - *(long *)pvVar27) >> 2) < (int)uVar5);
      return (llama_tokens *)pvVar27;
    }
    if (0 < (int)uVar22) {
      llama_kv_self_seq_rm(spec->ctx,0,0,uVar22);
      llama_kv_self_seq_add(spec->ctx,0,uVar22,0xffffffff);
      piVar18 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar9 = piVar18 + uVar22;
      __n = (long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish - (long)piVar9;
      piVar8 = piVar9;
      if (__n != 0) {
        memmove(piVar18,piVar9,__n);
        piVar8 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      piVar18 = (pointer)((long)piVar18 + ((long)piVar8 - (long)piVar9));
      if (piVar8 != piVar18) {
        (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = piVar18;
        piVar8 = piVar18;
      }
    }
    plVar19 = local_88;
    if ((int)((ulong)((long)piVar8 - *(long *)local_48) >> 2) <= (int)uVar24) goto LAB_0020fde6;
    llama_kv_self_seq_rm(spec->ctx,0,uVar24,0xffffffff);
    piVar9 = (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar24;
    if (piVar9 == (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish) goto LAB_0020fde6;
  }
  (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = piVar9;
LAB_0020fde6:
  local_98 = &spec->batch;
  common_batch_clear(local_98);
  uVar21 = (ulong)(int)(uVar25 + uVar24);
  piVar9 = (plVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if (uVar21 < (ulong)((long)(plVar19->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                             super__Vector_impl_data._M_finish - (long)piVar9 >> 2)) {
    lVar17 = uVar21 * 4;
    do {
      lVar2 = piVar9[uVar21];
      local_ac = 0;
      __l._M_len = 1;
      __l._M_array = &local_ac;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,__l,(allocator_type *)&local_80);
      common_batch_add(local_98,lVar2,uVar24,(vector<int,_std::allocator<int>_> *)&local_68,false);
      if (local_68._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
      piVar9 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      iVar3._M_current =
           (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_48,iVar3,(int *)((long)piVar9 + lVar17));
        piVar9 = (local_88->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        *iVar3._M_current = *(int *)((long)piVar9 + lVar17);
        (spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_finish = iVar3._M_current + 1;
      }
      uVar21 = uVar21 + 1;
      uVar24 = uVar24 + 1;
      lVar17 = lVar17 + 4;
    } while (uVar21 < (ulong)((long)(local_88->super__Vector_base<int,_std::allocator<int>_>).
                                    _M_impl.super__Vector_impl_data._M_finish - (long)piVar9 >> 2));
  }
  if (0 < local_98->n_tokens) {
    llama_decode(spec->ctx);
  }
  uVar5 = local_70;
  pvVar27 = local_a8;
  local_78 = (ulong)((long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(spec->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  if (0 < common_log_verbosity_thold) {
    pcVar7 = common_log_main();
    common_log_add(pcVar7,GGML_LOG_LEVEL_DEBUG,"%s: n_past = %d\n","common_speculative_gen_draft",
                   local_78);
  }
  common_batch_clear(local_98);
  lVar2 = local_8c;
  local_ac = 0;
  __l_00._M_len = 1;
  __l_00._M_array = &local_ac;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_68,__l_00,(allocator_type *)&local_80);
  common_batch_add(local_98,lVar2,(llama_pos)local_78,(vector<int,_std::allocator<int>_> *)&local_68
                   ,true);
  if (local_68._M_dataplus._M_p != (pointer)0x0) {
    operator_delete(local_68._M_dataplus._M_p,
                    local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
  }
  iVar3._M_current =
       (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar3._M_current ==
      (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(local_48,iVar3,&local_8c);
  }
  else {
    *iVar3._M_current = local_8c;
    (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
    ._M_finish = iVar3._M_current + 1;
  }
  llama_decode(local_a0->ctx);
  common_sampler_reset(local_a0->smpl);
  if (0 < (int)uVar5) {
    local_78 = (ulong)((int)local_78 + 1);
    local_40 = 0;
    do {
      common_batch_clear(local_98);
      pcVar4 = local_a0;
      common_sampler_sample(local_a0->smpl,local_a0->ctx,0,true);
      plVar10 = common_sampler_get_candidates(pcVar4->smpl);
      sVar11 = plVar10->size;
      if (0 < (int)sVar11) {
        lVar17 = 8;
        uVar21 = 0;
        do {
          if (0 < common_log_verbosity_thold) {
            pcVar7 = common_log_main();
            uVar24 = *(uint *)((long)plVar10->data + lVar17 + -8);
            local_88 = (llama_tokens *)
                       CONCAT44(local_88._4_4_,*(undefined4 *)((long)&plVar10->data->id + lVar17));
            common_token_to_piece_abi_cxx11_(&local_68,local_a0->ctx,uVar24,true);
            common_log_add(pcVar7,GGML_LOG_LEVEL_DEBUG,
                           " - draft candidate %3d, pos %3d: %6d (%8.3f) \'%s\'\n",
                           SUB84((double)local_88._0_4_,0),uVar21 & 0xffffffff,local_40,
                           (ulong)uVar24,local_68._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_68._M_dataplus._M_p != &local_68.field_2) {
              operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
            }
            sVar11 = plVar10->size;
          }
          uVar21 = uVar21 + 1;
          iVar6 = 3;
          if ((int)sVar11 < 3) {
            iVar6 = (int)sVar11;
          }
          lVar17 = lVar17 + 0xc;
        } while ((long)uVar21 < (long)iVar6);
      }
      pvVar27 = local_a8;
      local_ac = plVar10->data->id;
      common_sampler_accept(local_a0->smpl,local_ac,true);
      uVar5 = local_70;
      iVar3._M_current = *(int **)(pvVar27 + 8);
      if (iVar3._M_current == *(int **)(pvVar27 + 0x10)) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>(pvVar27,iVar3,&local_ac)
        ;
        piVar13 = *(int **)(pvVar27 + 8);
      }
      else {
        *iVar3._M_current = local_ac;
        piVar13 = iVar3._M_current + 1;
        *(int **)(pvVar27 + 8) = piVar13;
      }
      iVar6 = local_ac;
      if ((int)(uint)uVar5 <= (int)((ulong)((long)piVar13 - *(long *)pvVar27) >> 2)) {
        return (llama_tokens *)pvVar27;
      }
      pfVar1 = &plVar10->data->p;
      if (*pfVar1 <= local_34 && local_34 != *pfVar1) {
        return (llama_tokens *)pvVar27;
      }
      local_80 = 0;
      __l_01._M_len = 1;
      __l_01._M_array = &local_80;
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)&local_68,__l_01,&local_79);
      common_batch_add(local_98,iVar6,(int)local_78 + (int)local_40,
                       (vector<int,_std::allocator<int>_> *)&local_68,true);
      if (local_68._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_68._M_dataplus._M_p,
                        local_68.field_2._M_allocated_capacity - (long)local_68._M_dataplus._M_p);
      }
      llama_decode(local_a0->ctx);
      iVar3._M_current =
           (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_48,iVar3,&local_ac);
      }
      else {
        *iVar3._M_current = local_ac;
        (local_a0->prompt).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar3._M_current + 1;
      }
      uVar24 = (int)local_40 + 1;
      local_40 = (ulong)uVar24;
    } while (uVar24 != (uint)uVar5);
  }
  return (llama_tokens *)pvVar27;
}

Assistant:

llama_tokens common_speculative_gen_draft(
        struct common_speculative * spec,
        struct common_speculative_params params,
        const llama_tokens & prompt_tgt,
        llama_token id_last) {
    auto & batch  = spec->batch;
    auto & ctx    = spec->ctx;
    auto & smpl   = spec->smpl;
    auto & prompt = spec->prompt;

    int reuse_i = 0;
    int reuse_n = 0;

    const int n_ctx = llama_n_ctx(ctx) - params.n_draft;

    const int i_start = std::max<int>(0, (int) prompt_tgt.size() - n_ctx);

    // reuse as much as possible from the old draft context
    // ideally, the draft context should be as big as the target context and we will always reuse the entire prompt
    for (int i = 0; i < (int) prompt.size(); ++i) {
        int cur = 0;
        while (i_start + cur < (int) prompt_tgt.size() &&
               i       + cur < (int) prompt.size() &&
               prompt_tgt[i_start + cur] == prompt[i + cur]) {
            cur++;
        }

        if ((cur >= params.n_reuse || n_ctx >= (int) prompt_tgt.size()) && cur > reuse_n) {
            reuse_i = i;
            reuse_n = cur;
        }
    }

    LOG_DBG("%s: reuse_i = %d, reuse_n = %d, prompt = %d\n", __func__, reuse_i, reuse_n, (int) prompt.size());

    llama_tokens result;
    result.reserve(params.n_draft);

    if (reuse_n == 0) {
        llama_kv_self_clear(ctx);

        prompt.clear();
    } else {
        // this happens when a previous draft has been discarded (for example, due to being too small), but the
        // target model agreed with it. in this case, we simply pass back the previous results to save compute
        if (reuse_i + reuse_n < (int) prompt.size() && prompt[reuse_i + reuse_n] == id_last) {
            for (int i = reuse_i + reuse_n + 1; i < (int) prompt.size(); ++i) {
                result.push_back(prompt[i]);

                if (params.n_draft <= (int) result.size()) {
                    break;
                }
            }

            return result;
        }

        if (reuse_i > 0) {
            llama_kv_self_seq_rm (ctx, 0, 0, reuse_i);
            llama_kv_self_seq_add(ctx, 0, reuse_i, -1, -reuse_i);

            prompt.erase(prompt.begin(), prompt.begin() + reuse_i);
        }

        if (reuse_n < (int) prompt.size()) {
            llama_kv_self_seq_rm (ctx, 0, reuse_n, -1);

            prompt.erase(prompt.begin() + reuse_n, prompt.end());
        }
    }

    // prepare a batch to evaluate any new tokens in the prompt
    common_batch_clear(batch);

    for (size_t i = i_start + reuse_n; i < prompt_tgt.size(); ++i) {
        //LOG_DBG("i = %d, i_start = %d, reuse_n = %d, i - i_start = %d, id = %6d\n", i, i_start, reuse_n, i - i_start, prompt_tgt[i]);
        common_batch_add(batch, prompt_tgt[i], i - i_start, { 0 }, false);

        prompt.push_back(prompt_tgt[i]);
    }

    // we should rarely end-up here during normal decoding
    if (batch.n_tokens > 0) {
        //LOG_DBG("%s: draft prompt batch: %s\n", __func__, string_from(ctx, batch).c_str());

        llama_decode(ctx, batch);
    }

    const llama_pos n_past = prompt.size();

    LOG_DBG("%s: n_past = %d\n", __func__, n_past);

    common_batch_clear(batch);
    common_batch_add  (batch, id_last, n_past, { 0 }, true);

    prompt.push_back(id_last);

    //LOG_DBG("%s: draft prompt: %s\n", __func__, string_from(ctx, prompt).c_str());

    llama_decode(ctx, batch);

    common_sampler_reset(smpl);

    // sample n_draft tokens from the draft model
    for (int i = 0; i < params.n_draft; ++i) {
        common_batch_clear(batch);

        common_sampler_sample(smpl, ctx, 0, true);

        const auto * cur_p = common_sampler_get_candidates(smpl);

        for (int k = 0; k < std::min(3, (int) cur_p->size); ++k) {
            LOG_DBG(" - draft candidate %3d, pos %3d: %6d (%8.3f) '%s'\n",
                    k, i, cur_p->data[k].id, cur_p->data[k].p, common_token_to_piece(ctx, cur_p->data[k].id).c_str());
        }

        // add drafted token for each sequence
        const llama_token id = cur_p->data[0].id;

        common_sampler_accept(smpl, id, true);

        result.push_back(id);

        if (params.n_draft <= (int) result.size()) {
            break;
        }

        // only collect very high-confidence draft tokens
        if (cur_p->data[0].p < params.p_min) {
            break;
        }

        common_batch_add(batch, id, n_past + i + 1, { 0 }, true);

        // evaluate the drafted tokens on the draft model
        llama_decode(ctx, batch);

        prompt.push_back(id);
    }

    return result;
}